

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_xml.cpp
# Opt level: O2

void __thiscall BasisIoTest_ReadXML_Test::~BasisIoTest_ReadXML_Test(BasisIoTest_ReadXML_Test *this)

{
  BasisIoTest::~BasisIoTest(&this->super_BasisIoTest);
  operator_delete(this,0x40);
  return;
}

Assistant:

TEST_F(BasisIoTest, ReadXML) {
  ptree pt;
  ptree& root = pt.put("LATTICES", "");

  write_xml(root, "simple1d", basis1);
  write_xml(root, "simple2d", basis2);

  std::map<std::string, basis> lattices;
  for (auto& child : pt.get_child("LATTICES")) {
    if (child.first == "LATTICE") {
      std::string name;
      basis bs;
      child.second >> bs;
      lattices[name] = bs;
    }
  }
  EXPECT_EQ(basis1.basis_vectors(), lattices["simple1d"].basis_vectors());
  EXPECT_EQ(basis2.basis_vectors(), lattices["simple2d"].basis_vectors());

  basis bs;
  EXPECT_TRUE(read_xml(pt, "simple1d", bs));
  EXPECT_EQ(basis1.basis_vectors(), bs.basis_vectors());
  EXPECT_TRUE(read_xml(pt, "simple2d", bs));
  EXPECT_EQ(basis2.basis_vectors(), bs.basis_vectors());
}